

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Singular.hpp
# Opt level: O2

bool mserialize::detail::singular_impl(string_view full_tag,string_view tag,int max_recursion)

{
  bool bVar1;
  runtime_error *this;
  string_view full_tag_local;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  full_tag_local._len = full_tag._len;
  full_tag_local._ptr = full_tag._ptr;
  if (max_recursion == 0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    string_view::to_string_abi_cxx11_(&local_58,&full_tag_local);
    std::operator+(&local_38,"Recursion limit exceeded while visiting tag: ",&local_58);
    std::runtime_error::runtime_error(this,(string *)&local_38);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (tag._len == 0) {
    bVar1 = true;
  }
  else {
    if (*tag._ptr == '{') {
      bVar1 = singular_struct(full_tag,tag,max_recursion + -1);
      return bVar1;
    }
    if (*tag._ptr == '(') {
      bVar1 = singular_tuple(full_tag,tag,max_recursion + -1);
      return bVar1;
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

inline bool singular_impl(string_view full_tag, string_view tag, int max_recursion)
{
  if (max_recursion == 0) { throw std::runtime_error("Recursion limit exceeded while visiting tag: " + full_tag.to_string()); }

  if (tag.empty()) { return true; }

  switch (tag.front())
  {
  case '(':
    return singular_tuple(full_tag, tag, max_recursion - 1);
  case '{':
    return singular_struct(full_tag, tag, max_recursion - 1);
  }

  return false;
}